

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_ptr.hpp
# Opt level: O2

void __thiscall
duckdb::optional_ptr<duckdb::ReplacementScanData,_true>::CheckValid
          (optional_ptr<duckdb::ReplacementScanData,_true> *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->ptr != (ReplacementScanData *)0x0) {
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Attempting to dereference an optional pointer that is not set",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CheckValid() const {
		if (MemorySafety<SAFE>::ENABLED) {
			if (!ptr) {
				throw InternalException("Attempting to dereference an optional pointer that is not set");
			}
		}
	}